

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanKey
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char16 local_22;
  bool endFound;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLStack_20;
  char16 c;
  List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *charList_local;
  TextFormatReader *this_local;
  
  pLStack_20 = charList;
  charList_local =
       (List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)this;
  JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Clear
            (charList);
  local_22 = L'\0';
  bVar1 = false;
  while ((bVar2 = FileReader::PeekRawChar(&this->super_FileReader,&local_22), bVar2 &&
         (((local_22 == L'\t' || local_22 == L'\r') || local_22 == L'\n') || local_22 == L' '))) {
    FileReader::ReadRawChar(&this->super_FileReader,&local_22);
  }
  do {
    bVar2 = FileReader::PeekRawChar(&this->super_FileReader,&local_22);
    if (!bVar2) {
LAB_00d0200b:
      if (bVar1) {
        this_local._4_4_ = String;
      }
      else {
        this_local._4_4_ = Error;
      }
      return this_local._4_4_;
    }
    if ((local_22 == L'\0') ||
       (iVar3 = JsUtil::ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>::Count
                          (&pLStack_20->
                            super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>),
       0x100 < iVar3)) {
      return Error;
    }
    if (local_22 == L':') {
      bVar1 = true;
      goto LAB_00d0200b;
    }
    FileReader::ReadRawChar(&this->super_FileReader,&local_22);
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (pLStack_20,&local_22);
  } while( true );
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanKey(JsUtil::List<char16, HeapAllocator>& charList)
    {
        charList.Clear();

        char16 c = _u('\0');
        bool endFound = false;

        //Read off any whitespace
        while(this->PeekRawChar(&c))
        {
            if((c != _u('\t')) & (c != _u('\r')) & (c != _u('\n')) & (c != _u(' ')))
            {
                break;
            }

            this->ReadRawChar(&c);
        }

        while(this->PeekRawChar(&c))
        {
            if(c == 0 || charList.Count() > 256)
            {
                //we reached the end of the file or the "key" is much longer than it should be
                return NSTokens::ParseTokenKind::Error;
            }

            if(c == _u(':'))
            {
                //end of the string
                endFound = true;
                break;
            }
            else
            {
                this->ReadRawChar(&c);
                charList.Add(c);
            }
        }

        if(!endFound)
        {
            // no ending found
            return NSTokens::ParseTokenKind::Error;
        }

        return NSTokens::ParseTokenKind::String;
    }